

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O3

PClassActor * __thiscall AActor::GetBloodType(AActor *this,int type)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PClass *pPVar2;
  PClassActor *pPVar3;
  FName *zaname;
  FName local_14 [3];
  
  if (type == 2) {
    pPVar2 = (this->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar2 = (PClass *)CONCAT44(extraout_var_01,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar2;
    }
    iVar1 = *(int *)&pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.field_0xa4;
    zaname = local_14 + 2;
  }
  else if (type == 1) {
    pPVar2 = (this->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar2 = (PClass *)CONCAT44(extraout_var_00,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar2;
    }
    iVar1 = pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index;
    zaname = local_14 + 1;
  }
  else {
    if (type != 0) {
      return (PClassActor *)0x0;
    }
    pPVar2 = (this->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar2;
    }
    iVar1 = *(int *)((long)&pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.Outer + 4);
    zaname = local_14;
  }
  zaname->Index = iVar1;
  pPVar2 = PClass::FindClass(zaname);
  pPVar3 = dyn_cast<PClassActor>((DObject *)pPVar2);
  if (pPVar3 == (PClassActor *)0x0) {
    return (PClassActor *)0x0;
  }
  pPVar3 = PClassActor::GetReplacement(pPVar3,true);
  return pPVar3;
}

Assistant:

PClassActor *GetBloodType(int type = 0) const
	{
		PClassActor *bloodcls;
		if (type == 0)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType);
		}
		else if (type == 1)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType2);
		}
		else if (type == 2)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType3);
		}
		else
		{
			return NULL;
		}

		if (bloodcls != NULL)
		{
			bloodcls = bloodcls->GetReplacement();
		}
		return bloodcls;
	}